

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_coverer.cc
# Opt level: O1

void __thiscall S2RegionCoverer::Options::set_level_mod(Options *this,int level_mod)

{
  int iVar1;
  S2LogMessage SStack_18;
  
  if (level_mod < 1) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2region_coverer.cc"
               ,0x51,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (level_mod) >= (1) ",0x21);
  }
  else {
    if (level_mod < 4) {
      iVar1 = 1;
      if (1 < level_mod) {
        iVar1 = level_mod;
      }
      this->level_mod_ = iVar1;
      return;
    }
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2region_coverer.cc"
               ,0x52,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (level_mod) <= (3) ",0x21);
  }
  abort();
}

Assistant:

void S2RegionCoverer::Options::set_level_mod(int level_mod) {
  S2_DCHECK_GE(level_mod, 1);
  S2_DCHECK_LE(level_mod, 3);
  level_mod_ = max(1, min(3, level_mod));
}